

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::hasSingleNextBlock
          (InvocationInterlockPlacementPass *this,uint32_t block_id,bool reverse_cfg)

{
  Op OVar1;
  uint32_t uVar2;
  CFG *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  undefined3 in_register_00000011;
  bool bVar4;
  Function *local_20;
  
  this_00 = Pass::cfg(&this->super_Pass);
  if (CONCAT31(in_register_00000011,reverse_cfg) == 0) {
    pvVar3 = CFG::preds(this_00,block_id);
    bVar4 = (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start == 4;
  }
  else {
    CFG::block(this_00,block_id);
    BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffe0);
    OVar1 = *(Op *)&(local_20->debug_insts_in_header_).
                    super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                    super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase;
    if (OVar1 == OpBranchConditional) {
      bVar4 = false;
    }
    else if (OVar1 == OpSwitch) {
      BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffe0);
      uVar2 = Instruction::NumInOperandWords((Instruction *)local_20);
      bVar4 = uVar2 == 1;
    }
    else {
      BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffe0);
      bVar4 = Instruction::IsReturnOrAbort((Instruction *)local_20);
      bVar4 = !bVar4;
    }
  }
  return bVar4;
}

Assistant:

bool InvocationInterlockPlacementPass::hasSingleNextBlock(uint32_t block_id,
                                                          bool reverse_cfg) {
  if (reverse_cfg) {
    // We are traversing forward, so check whether there is a single successor.
    BasicBlock* block = cfg()->block(block_id);

    switch (block->tail()->opcode()) {
      case spv::Op::OpBranchConditional:
        return false;
      case spv::Op::OpSwitch:
        return block->tail()->NumInOperandWords() == 1;
      default:
        return !block->tail()->IsReturnOrAbort();
    }
  } else {
    // We are traversing backward, so check whether there is a single
    // predecessor.
    return cfg()->preds(block_id).size() == 1;
  }
}